

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_invalid_opc.cpp
# Opt level: O0

Status __thiscall spvtools::opt::ReplaceInvalidOpcodePass::Process(ReplaceInvalidOpcodePass *this)

{
  bool bVar1;
  ExecutionModel model;
  IRContext *this_00;
  FeatureManager *this_01;
  Module *this_02;
  reference function;
  bool bVar2;
  Function *func;
  iterator __end2;
  iterator __begin2;
  Module *__range2;
  ExecutionModel execution_model;
  bool modified;
  ReplaceInvalidOpcodePass *this_local;
  
  bVar2 = false;
  this_00 = Pass::context(&this->super_Pass);
  this_01 = IRContext::get_feature_mgr(this_00);
  bVar1 = FeatureManager::HasCapability(this_01,CapabilityLinkage);
  if (bVar1) {
    this_local._4_4_ = SuccessWithoutChange;
  }
  else {
    model = GetExecutionModel(this);
    if (model == ExecutionModelKernel) {
      this_local._4_4_ = SuccessWithoutChange;
    }
    else if (model == ExecutionModelMax) {
      this_local._4_4_ = SuccessWithoutChange;
    }
    else {
      this_02 = Pass::get_module(&this->super_Pass);
      join_0x00000010_0x00000000_ = Module::begin(this_02);
      _func = Module::end(this_02);
      while (bVar1 = UptrVectorIterator<spvtools::opt::Function,_false>::operator!=
                               ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                                &__end2.iterator_,
                                (UptrVectorIterator<spvtools::opt::Function,_false> *)&func), bVar1)
      {
        function = UptrVectorIterator<spvtools::opt::Function,_false>::operator*
                             ((UptrVectorIterator<spvtools::opt::Function,_false> *)
                              &__end2.iterator_);
        bVar1 = RewriteFunction(this,function,model);
        bVar2 = bVar2 || bVar1;
        UptrVectorIterator<spvtools::opt::Function,_false>::operator++
                  ((UptrVectorIterator<spvtools::opt::Function,_false> *)&__end2.iterator_);
      }
      this_local._4_4_ = SuccessWithoutChange;
      if (bVar2) {
        this_local._4_4_ = SuccessWithChange;
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status ReplaceInvalidOpcodePass::Process() {
  bool modified = false;

  if (context()->get_feature_mgr()->HasCapability(spv::Capability::Linkage)) {
    return Status::SuccessWithoutChange;
  }

  spv::ExecutionModel execution_model = GetExecutionModel();
  if (execution_model == spv::ExecutionModel::Kernel) {
    // We do not handle kernels.
    return Status::SuccessWithoutChange;
  }
  if (execution_model == spv::ExecutionModel::Max) {
    // Mixed execution models for the entry points.  This case is not currently
    // handled.
    return Status::SuccessWithoutChange;
  }

  for (Function& func : *get_module()) {
    modified |= RewriteFunction(&func, execution_model);
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}